

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

void __thiscall ASDCP::MXF::EssenceContainerData::Dump(EssenceContainerData *this,FILE *stream)

{
  char *pcVar1;
  char identbuf [128];
  char local_98 [136];
  
  local_98[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,stream);
  pcVar1 = UMID::EncodeString(&this->LinkedPackageUID,local_98,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","LinkedPackageUID",pcVar1);
  if ((this->IndexSID).m_has_value == true) {
    fprintf((FILE *)stream,"  %22s = %d\n","IndexSID",(ulong)(this->IndexSID).m_property);
  }
  fprintf((FILE *)stream,"  %22s = %d\n","BodySID",(ulong)this->BodySID);
  return;
}

Assistant:

void
EssenceContainerData::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "LinkedPackageUID", LinkedPackageUID.EncodeString(identbuf, IdentBufferLen));
  if ( ! IndexSID.empty() ) {
    fprintf(stream, "  %22s = %d\n",  "IndexSID", IndexSID.get());
  }
  fprintf(stream, "  %22s = %d\n",  "BodySID", BodySID);
}